

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Template.hpp
# Opt level: O3

bool __thiscall
Qentem::TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::evaluateExpression
          (TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_> *this,
          QExpression *left,QExpression *right,QOperation oper)

{
  bool bVar1;
  ulong uVar2;
  QExpression *pQVar3;
  undefined7 in_register_00000009;
  
  switch((int)CONCAT71(in_register_00000009,oper)) {
  case 1:
    if (left->Type == NaturalNumber) {
      uVar2 = 1;
      if ((left->field_0).SubExpressions.storage_ == (QExpression *)0x0) goto LAB_001156ef;
    }
    else if (left->Type == IntegerNumber) {
      uVar2 = 1;
      if ((long)(left->field_0).SubExpressions.storage_ < 1) {
LAB_001156ef:
        if (right->Type == IntegerNumber) {
          bVar1 = 0 < (long)(right->field_0).SubExpressions.storage_;
        }
        else if (right->Type == NaturalNumber) {
          bVar1 = (right->field_0).SubExpressions.storage_ != (QExpression *)0x0;
        }
        else {
          bVar1 = 0.0 < *(double *)&right->field_0;
        }
        goto LAB_00115722;
      }
    }
    else {
      uVar2 = 1;
      if (*(double *)&left->field_0 <= 0.0) goto LAB_001156ef;
    }
    goto LAB_00115725;
  case 2:
    if (left->Type == NaturalNumber) {
      if ((left->field_0).SubExpressions.storage_ == (QExpression *)0x0) goto LAB_00115706;
    }
    else if (left->Type == IntegerNumber) {
      if ((long)(left->field_0).SubExpressions.storage_ < 1) {
LAB_00115706:
        uVar2 = 0;
        goto LAB_00115725;
      }
    }
    else if (*(double *)&left->field_0 <= 0.0) goto LAB_00115706;
    goto LAB_001156ef;
  case 3:
    bVar1 = isEqual(this,left,right);
    if (!bVar1) {
      return false;
    }
    break;
  case 4:
    bVar1 = isEqual(this,left,right);
    if (!bVar1) {
      return false;
    }
    *(byte *)&left->field_0 = *(byte *)&left->field_0 ^ 1;
    break;
  case 5:
    bVar1 = QExpression::operator>=(left,right);
    goto LAB_00115722;
  case 6:
    bVar1 = QExpression::operator<=(left,right);
    goto LAB_00115722;
  case 7:
    bVar1 = QExpression::operator>(left,right);
    goto LAB_00115722;
  case 8:
    bVar1 = QExpression::operator<(left,right);
LAB_00115722:
    uVar2 = (ulong)bVar1;
LAB_00115725:
    *(ulong *)&left->field_0 = uVar2;
    left->Type = NaturalNumber;
    break;
  case 9:
    QExpression::operator|=(left,right);
    break;
  case 10:
    QExpression::operator&=(left,right);
    break;
  case 0xb:
    QExpression::operator+=(left,right);
    break;
  case 0xc:
    QExpression::operator-=(left,right);
    break;
  case 0xd:
    QExpression::operator*=(left,right);
    break;
  case 0xe:
    if ((right->Type == NaturalNumber) || (right->Type == IntegerNumber)) {
      if ((right->field_0).SubExpressions.storage_ == (QExpression *)0x0) {
        return false;
      }
    }
    else if ((*(double *)&right->field_0 == 0.0) && (!NAN(*(double *)&right->field_0))) {
      return false;
    }
    QExpression::operator/=(left,right);
    break;
  case 0xf:
    pQVar3 = (QExpression *)QExpression::operator%(left,right);
    (left->field_0).SubExpressions.storage_ = pQVar3;
    left->Type = IntegerNumber;
    break;
  case 0x10:
    bVar1 = QExpression::operator^=(left,right);
    return bVar1;
  }
  return true;
}

Assistant:

bool evaluateExpression(QExpression &left, QExpression &right, const QOperation oper) const noexcept {
        switch (oper) {
            case QOperation::Exponent: { // ^
                return (left ^= right);
            }

            case QOperation::Remainder: { // %
                left.Value.Number.Integer = (left % right);
                left.Type                 = ExpressionType::IntegerNumber;
                break;
            }

            case QOperation::Multiplication: { // *
                left *= right;
                break;
            }

            case QOperation::Division: { // /
                if (right != 0ULL) {
                    left /= right;
                    break;
                }

                return false;
            }

            case QOperation::Addition: { // +
                left += right;
                break;
            }

            case QOperation::Subtraction: { // -
                left -= right;
                break;
            }

            case QOperation::BitwiseAnd: { // &
                left &= right;
                break;
            }

            case QOperation::BitwiseOr: { // |
                left |= right;
                break;
            }

            case QOperation::Less: { // <
                left.Value.Number.Natural = SizeT64(left < right);
                left.Type                 = ExpressionType::NaturalNumber;
                break;
            }

            case QOperation::LessOrEqual: { // <=
                left.Value.Number.Natural = SizeT64(left <= right);
                left.Type                 = ExpressionType::NaturalNumber;
                break;
            }

            case QOperation::Greater: { // >
                left.Value.Number.Natural = SizeT64(left > right);
                left.Type                 = ExpressionType::NaturalNumber;
                break;
            }

            case QOperation::GreaterOrEqual: { // >=
                left.Value.Number.Natural = SizeT64(left >= right);
                left.Type                 = ExpressionType::NaturalNumber;
                break;
            }

            case QOperation::And: { // &&
                left.Value.Number.Natural = SizeT64((left > 0U) && (right > 0U));
                left.Type                 = ExpressionType::NaturalNumber;
                break;
            }

            case QOperation::Or: { // ||
                left.Value.Number.Natural = SizeT64((left > 0U) || (right > 0U));
                left.Type                 = ExpressionType::NaturalNumber;
                break;
            }

            case QOperation::Equal: { // ==
                if (isEqual(left, right)) {
                    break;
                }

                return false;
            }

            case QOperation::NotEqual: { // !=
                if (isEqual(left, right)) {
                    left.Value.Number.Natural = (left.Value.Number.Natural ^ 1ULL);
                    break;
                }

                return false;
            }

            default: {
                // It will not reach this.
            }
        }

        return true;
    }